

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

double __thiscall
VariationalBayesEstimatorOnLDA::calculateVariationalLowerBound(VariationalBayesEstimatorOnLDA *this)

{
  double __x;
  uint uVar1;
  long lVar2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar3;
  pointer pvVar4;
  int v;
  ulong uVar5;
  ulong uVar6;
  int l;
  int k;
  ulong uVar7;
  ulong uVar8;
  type tVar9;
  type tVar10;
  double dVar11;
  double dVar12;
  double local_50;
  double local_48;
  
  local_48 = 0.0;
  for (uVar7 = 0; uVar5 = (ulong)this->_K, uVar7 < uVar5; uVar7 = uVar7 + 1) {
    tVar9 = boost::math::lgamma<double>(this->_betaSum);
    tVar10 = boost::math::lgamma<double>
                       ((this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7] + this->_betaSum);
    local_48 = local_48 + (tVar9 - tVar10);
    for (uVar5 = 0; uVar5 < this->_V; uVar5 = uVar5 + 1) {
      tVar9 = boost::math::lgamma<double>
                        (*(double *)
                          (*(long *)&(this->_nkv).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar5 * 8) +
                         (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar5]);
      tVar10 = boost::math::lgamma<double>
                         ((this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
      local_48 = local_48 + (tVar9 - tVar10);
    }
  }
  local_50 = 0.0;
  for (uVar7 = 0; uVar7 < this->_D; uVar7 = uVar7 + 1) {
    tVar9 = boost::math::lgamma<double>(this->_alphaSum);
    tVar10 = boost::math::lgamma<double>
                       ((this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7] + this->_alphaSum);
    local_50 = local_50 + (tVar9 - tVar10);
    for (uVar6 = 0; uVar5 = (ulong)this->_K, uVar6 < uVar5; uVar6 = uVar6 + 1) {
      tVar9 = boost::math::lgamma<double>
                        (*(double *)
                          (*(long *)&(this->_ndk).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar6 * 8) +
                         (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6]);
      tVar10 = boost::math::lgamma<double>
                         ((this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar6]);
      local_50 = local_50 + (tVar9 - tVar10);
    }
  }
  pvVar3 = this->_docVoca;
  pvVar4 = (pvVar3->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dVar12 = 0.0;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(pvVar3->
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18);
      uVar7 = uVar7 + 1) {
    for (uVar6 = 0;
        lVar2 = *(long *)&pvVar4[uVar7].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data,
        uVar6 < (ulong)((long)*(pointer *)
                               ((long)&pvVar4[uVar7].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 2);
        uVar6 = uVar6 + 1) {
      uVar1 = *(uint *)(lVar2 + uVar6 * 4);
      for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
        __x = *(double *)
               (*(long *)(*(long *)&(this->_qz).
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data + uVar6 * 0x18) + uVar8 * 8);
        if ((__x != 0.0) || (NAN(__x))) {
          dVar11 = log(__x);
          dVar12 = dVar12 + (double)*(uint *)(*(long *)&(this->_frequencyMatrix->
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data +
                                             (ulong)uVar1 * 4) * dVar11 * __x;
          uVar5 = (ulong)this->_K;
        }
      }
      pvVar3 = this->_docVoca;
      pvVar4 = (pvVar3->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  return (local_48 + local_50) - dVar12;
}

Assistant:

double VariationalBayesEstimatorOnLDA::calculateVariationalLowerBound()const{//{{{
    double term1=0, term2=0;
    for(int k=0; k<_K; k++){
        term1 += boost::math::lgamma(_betaSum) - boost::math::lgamma(_nk[k]+_betaSum);
        for(int v=0; v<_V; v++){
            try{
                term1 += boost::math::lgamma(_nkv[k][v]+_beta[v]) - boost::math::lgamma(_beta[v]);
            }catch(...){
                term1 += 0;
            }
        }
    }
    for(int d=0; d<_D; d++){
        term2 += boost::math::lgamma(_alphaSum) - boost::math::lgamma(_nd[d]+_alphaSum);
        for(int k=0; k<_K; k++){
        //ndk == 0 -> alphak == 0  lgamma(0) - lgamma(0) = 0
            try{
                term2 += boost::math::lgamma(_ndk[d][k]+_alpha[k]) - boost::math::lgamma(_alpha[k]);
            }catch(...){
                term2 += 0;
            }
        }
    }
    double term3 = 0;
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                if(_qz[d][l][k] != 0){
                    term3 += _qz[d][l][k] * log(_qz[d][l][k]) * _frequencyMatrix[d][v];
                }
            }
        }
    }
    double variationalLowerBound = term1 + term2 - term3;
    return(variationalLowerBound);
}